

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
utility::random_vector<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t size,int min,int max)

{
  pointer piVar1;
  result_type_conflict2 rVar2;
  long lVar3;
  long lVar4;
  default_random_engine generator;
  uniform_int_distribution<int> uniform;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_40;
  uniform_int_distribution<int> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,size,(allocator_type *)&local_38);
  local_40._M_x = 1;
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar4 != 0) {
    lVar3 = 0;
    local_38._M_param._M_a = min;
    local_38._M_param._M_b = max;
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()(&local_38,&local_40,&local_38._M_param)
      ;
      piVar1[lVar3] = rVar2;
      lVar3 = lVar3 + 1;
    } while (lVar4 >> 2 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }